

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# call_graph.cpp
# Opt level: O0

vector<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_int>,_std::allocator<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_int>_>_>
* __thiscall
HawkTracer::client::CallGraph::make
          (vector<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_int>,_std::allocator<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_int>_>_>
           *__return_storage_ptr__,CallGraph *this,
          vector<HawkTracer::client::CallGraph::NodeData,_std::allocator<HawkTracer::client::CallGraph::NodeData>_>
          *events)

{
  bool bVar1;
  iterator iVar2;
  iterator iVar3;
  reference node_data;
  NodeData *event;
  iterator __end2;
  iterator __begin2;
  vector<HawkTracer::client::CallGraph::NodeData,_std::allocator<HawkTracer::client::CallGraph::NodeData>_>
  *__range2;
  vector<HawkTracer::client::CallGraph::NodeData,_std::allocator<HawkTracer::client::CallGraph::NodeData>_>
  *events_local;
  CallGraph *this_local;
  
  iVar2 = std::
          vector<HawkTracer::client::CallGraph::NodeData,_std::allocator<HawkTracer::client::CallGraph::NodeData>_>
          ::begin(events);
  iVar3 = std::
          vector<HawkTracer::client::CallGraph::NodeData,_std::allocator<HawkTracer::client::CallGraph::NodeData>_>
          ::end(events);
  std::
  sort<__gnu_cxx::__normal_iterator<HawkTracer::client::CallGraph::NodeData*,std::vector<HawkTracer::client::CallGraph::NodeData,std::allocator<HawkTracer::client::CallGraph::NodeData>>>,HawkTracer::client::CallGraph::make(std::vector<HawkTracer::client::CallGraph::NodeData,std::allocator<HawkTracer::client::CallGraph::NodeData>>&)::__0>
            (iVar2._M_current,iVar3._M_current);
  __end2 = std::
           vector<HawkTracer::client::CallGraph::NodeData,_std::allocator<HawkTracer::client::CallGraph::NodeData>_>
           ::begin(events);
  event = (NodeData *)
          std::
          vector<HawkTracer::client::CallGraph::NodeData,_std::allocator<HawkTracer::client::CallGraph::NodeData>_>
          ::end(events);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<HawkTracer::client::CallGraph::NodeData_*,_std::vector<HawkTracer::client::CallGraph::NodeData,_std::allocator<HawkTracer::client::CallGraph::NodeData>_>_>
                                *)&event);
    if (!bVar1) break;
    node_data = __gnu_cxx::
                __normal_iterator<HawkTracer::client::CallGraph::NodeData_*,_std::vector<HawkTracer::client::CallGraph::NodeData,_std::allocator<HawkTracer::client::CallGraph::NodeData>_>_>
                ::operator*(&__end2);
    _add_event(this,node_data);
    __gnu_cxx::
    __normal_iterator<HawkTracer::client::CallGraph::NodeData_*,_std::vector<HawkTracer::client::CallGraph::NodeData,_std::allocator<HawkTracer::client::CallGraph::NodeData>_>_>
    ::operator++(&__end2);
  }
  std::
  vector<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_int>,_std::allocator<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_int>_>_>
  ::vector(__return_storage_ptr__,&this->_root_calls);
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::pair<std::shared_ptr<CallGraph::TreeNode>, int>> 
    CallGraph::make(std::vector<NodeData>& events)
{
    std::sort(events.begin(), events.end(), 
            [](const NodeData& e1, const NodeData& e2){
                return e1.start_ts < e2.start_ts;
            });
    for (const auto& event : events)
    {
        _add_event(event);
    }

    return _root_calls;
}